

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_edge_iterator.cc
# Opt level: O2

void __thiscall s2shapeutil::EdgeIterator::Next(EdgeIterator *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  
  iVar1 = this->num_edges_;
  iVar3 = this->edge_id_ + 1;
  while( true ) {
    this->edge_id_ = iVar3;
    if (iVar3 < iVar1) {
      return;
    }
    iVar3 = this->shape_id_ + 1;
    this->shape_id_ = iVar3;
    iVar1 = (*this->index_->_vptr_S2ShapeIndex[2])();
    if (iVar1 <= iVar3) break;
    iVar2 = (*this->index_->_vptr_S2ShapeIndex[3])(this->index_,(ulong)(uint)this->shape_id_);
    iVar3 = 0;
    iVar1 = 0;
    if ((long *)CONCAT44(extraout_var,iVar2) != (long *)0x0) {
      iVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))();
    }
    this->num_edges_ = iVar1;
    this->edge_id_ = -1;
  }
  return;
}

Assistant:

void EdgeIterator::Next() {
  while (++edge_id_ >= num_edges_) {
    if (++shape_id_ >= index_->num_shape_ids()) break;
    S2Shape* shape = index_->shape(shape_id_);
    num_edges_ = (shape == nullptr) ? 0 : shape->num_edges();
    edge_id_ = -1;
  }
}